

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O2

opj_tgt_tree_t * tgt_create_v2(OPJ_UINT32 numleafsh,OPJ_UINT32 numleafsv)

{
  opj_tgt_node *poVar1;
  OPJ_UINT32 OVar2;
  opj_tgt_tree_t *p_tree;
  opj_tgt_node_t *poVar3;
  ulong uVar4;
  int iVar5;
  opj_tgt_node *poVar6;
  opj_tgt_node *poVar7;
  char *__ptr;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  size_t sStack_130;
  OPJ_INT32 nplv [32];
  OPJ_INT32 nplh [32];
  
  uVar4 = (ulong)numleafsh;
  p_tree = (opj_tgt_tree_t *)calloc(1,0x20);
  if (p_tree == (opj_tgt_tree_t *)0x0) {
    __ptr = "ERROR in tgt_create_v2 while allocating tree\n";
    sStack_130 = 0x2d;
  }
  else {
    p_tree->numleafsh = numleafsh;
    p_tree->numleafsv = numleafsv;
    uVar12 = 0;
    uVar11 = 0xffffffffffffffff;
    OVar2 = numleafsv;
    nplv[0] = numleafsv;
    nplh[0] = numleafsh;
    do {
      uVar8 = OVar2 * (int)uVar4;
      uVar4 = (long)((int)uVar4 + 1) / 2;
      uVar9 = (int)uVar11 + 2;
      nplh[uVar9] = (OPJ_INT32)uVar4;
      OVar2 = (int)(OVar2 + 1) / 2;
      nplv[uVar9] = OVar2;
      uVar12 = uVar12 + uVar8;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (1 < uVar8);
    p_tree->numnodes = uVar12;
    if (uVar12 != 0) {
      poVar3 = (opj_tgt_node_t *)calloc((ulong)uVar12,0x18);
      p_tree->nodes = poVar3;
      if (poVar3 == (opj_tgt_node_t *)0x0) {
        fwrite("ERROR in tgt_create_v2 while allocating node of the tree\n",0x39,1,_stderr);
        free(p_tree);
        return (opj_tgt_tree_t *)0x0;
      }
      p_tree->nodes_size = uVar12 * 0x18;
      poVar6 = poVar3 + numleafsv * numleafsh;
      poVar7 = poVar6;
      for (uVar4 = 0; uVar4 != uVar11; uVar4 = uVar4 + 1) {
        uVar12 = nplv[uVar4];
        uVar9 = 0;
        uVar8 = uVar12;
        if ((int)uVar12 < 1) {
          uVar8 = uVar9;
        }
        for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
          iVar5 = nplh[uVar4];
          lVar10 = (long)iVar5;
          for (; 0 < iVar5; iVar5 = iVar5 + -2) {
            poVar3->parent = poVar6;
            if (iVar5 == 1) {
              poVar3 = poVar3 + 1;
            }
            else {
              poVar3[1].parent = poVar6;
              poVar3 = poVar3 + 2;
            }
            poVar6 = poVar6 + 1;
          }
          poVar1 = poVar7 + lVar10;
          if (uVar9 == uVar12 - 1 || (uVar9 & 1) != 0) {
            poVar1 = poVar6;
            poVar7 = poVar6;
          }
          poVar6 = poVar7;
          poVar7 = poVar1;
        }
      }
      poVar3->parent = (opj_tgt_node *)0x0;
      tgt_reset(p_tree);
      return p_tree;
    }
    free(p_tree);
    __ptr = "WARNING in tgt_create_v2 tree->numnodes == 0, no tree created.\n";
    sStack_130 = 0x3f;
  }
  fwrite(__ptr,sStack_130,1,_stderr);
  return (opj_tgt_tree_t *)0x0;
}

Assistant:

opj_tgt_tree_t *tgt_create_v2(OPJ_UINT32 numleafsh, OPJ_UINT32 numleafsv) {
	OPJ_INT32 nplh[32];
	OPJ_INT32 nplv[32];
	opj_tgt_node_t *node = 00;
	opj_tgt_node_t *l_parent_node = 00;
	opj_tgt_node_t *l_parent_node0 = 00;
	opj_tgt_tree_t *tree = 00;
	OPJ_UINT32 i;
	OPJ_INT32  j,k;
	OPJ_UINT32 numlvls;
	OPJ_UINT32 n;

	tree = (opj_tgt_tree_t *) opj_malloc(sizeof(opj_tgt_tree_t));
	if(!tree) {
		fprintf(stderr, "ERROR in tgt_create_v2 while allocating tree\n");
		return 00;
	}
	memset(tree,0,sizeof(opj_tgt_tree_t));

	tree->numleafsh = numleafsh;
	tree->numleafsv = numleafsv;

	numlvls = 0;
	nplh[0] = numleafsh;
	nplv[0] = numleafsv;
	tree->numnodes = 0;
	do {
		n = nplh[numlvls] * nplv[numlvls];
		nplh[numlvls + 1] = (nplh[numlvls] + 1) / 2;
		nplv[numlvls + 1] = (nplv[numlvls] + 1) / 2;
		tree->numnodes += n;
		++numlvls;
	} while (n > 1);

	/* ADD */
	if (tree->numnodes == 0) {
		opj_free(tree);
		fprintf(stderr, "WARNING in tgt_create_v2 tree->numnodes == 0, no tree created.\n");
		return 00;
	}

	tree->nodes = (opj_tgt_node_t*) opj_calloc(tree->numnodes, sizeof(opj_tgt_node_t));
	if(!tree->nodes) {
		fprintf(stderr, "ERROR in tgt_create_v2 while allocating node of the tree\n");
		opj_free(tree);
		return 00;
	}
	memset(tree->nodes,0,tree->numnodes * sizeof(opj_tgt_node_t));
	tree->nodes_size = tree->numnodes * sizeof(opj_tgt_node_t);

	node = tree->nodes;
	l_parent_node = &tree->nodes[tree->numleafsh * tree->numleafsv];
	l_parent_node0 = l_parent_node;

	for (i = 0; i < numlvls - 1; ++i) {
		for (j = 0; j < nplv[i]; ++j) {
			k = nplh[i];
			while (--k >= 0) {
				node->parent = l_parent_node;
				++node;
				if (--k >= 0) {
					node->parent = l_parent_node;
					++node;
				}
				++l_parent_node;
			}
			if ((j & 1) || j == nplv[i] - 1) {
				l_parent_node0 = l_parent_node;
			} else {
				l_parent_node = l_parent_node0;
				l_parent_node0 += nplh[i];
			}
		}
	}
	node->parent = 0;
	tgt_reset(tree);
	return tree;
}